

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::CameraTransform::CameraTransform(CameraTransform *this,AnimatedTransform *worldFromCamera)

{
  Transform *this_00;
  int iVar1;
  undefined1 auVar3 [56];
  undefined1 auVar2 [64];
  Point3f PVar4;
  Transform rfc [2];
  Transform renderFromWorld;
  Transform local_468;
  Transform local_3e8;
  Transform local_368;
  AnimatedTransform local_2e8;
  
  AnimatedTransform::AnimatedTransform(&this->renderFromCamera);
  this_00 = &this->worldFromRender;
  Transform::Transform(this_00);
  iVar1 = *(int *)(Options + 0x10);
  if (iVar1 == 2) {
    local_2e8.startTransform.mInv.m[0][0] = 0.0;
    local_2e8.startTransform.mInv.m[0][1] = 0.0;
    local_2e8.startTransform.mInv.m[0][2] = 0.0;
    local_2e8.startTransform.mInv.m[0][3] = 0.0;
    local_2e8.startTransform.mInv.m[1][0] = 0.0;
    local_2e8.startTransform.mInv.m[1][1] = 0.0;
    local_2e8.startTransform.mInv.m[1][2] = 0.0;
    local_2e8.startTransform.mInv.m[1][3] = 0.0;
    local_2e8.startTransform.mInv.m[2][0] = 0.0;
    local_2e8.startTransform.mInv.m[2][1] = 0.0;
    local_2e8.startTransform.mInv.m[2][2] = 0.0;
    local_2e8.startTransform.mInv.m[2][3] = 0.0;
    local_2e8.startTransform.mInv.m[3][0] = 0.0;
    local_2e8.startTransform.mInv.m[3][1] = 0.0;
    local_2e8.startTransform.mInv.m[3][2] = 0.0;
    local_2e8.startTransform.mInv.m[3][3] = 0.0;
    local_2e8.startTransform.m.m[0][0] = 0.0;
    local_2e8.startTransform.m.m[0][1] = 0.0;
    local_2e8.startTransform.m.m[0][2] = 0.0;
    local_2e8.startTransform.m.m[0][3] = 0.0;
    local_2e8.startTransform.m.m[1][0] = 0.0;
    local_2e8.startTransform.m.m[1][1] = 0.0;
    local_2e8.startTransform.m.m[1][2] = 0.0;
    local_2e8.startTransform.m.m[1][3] = 0.0;
    local_2e8.startTransform.m.m[2][0] = 0.0;
    local_2e8.startTransform.m.m[2][1] = 0.0;
    local_2e8.startTransform.m.m[2][2] = 0.0;
    local_2e8.startTransform.m.m[2][3] = 0.0;
    local_2e8.startTransform.m.m[3][0] = 0.0;
    local_2e8.startTransform.m.m[3][1] = 0.0;
    local_2e8.startTransform.m.m[3][2] = 0.0;
    local_2e8.startTransform.m.m[3][3] = 0.0;
    Transform::Transform(&local_2e8.startTransform);
  }
  else if (iVar1 == 1) {
    local_2e8.startTransform.m.m[0][0] = 0.0;
    local_2e8.startTransform.m.m[0][1] = 0.0;
    local_2e8.startTransform.m.m[0]._8_8_ =
         local_2e8.startTransform.m.m[0]._8_8_ & 0xffffffff00000000;
    auVar3 = (undefined1  [56])0x0;
    PVar4 = AnimatedTransform::operator()
                      (worldFromCamera,(Point3f *)&local_2e8,
                       (worldFromCamera->startTime + worldFromCamera->endTime) * 0.5);
    local_468.m.m[0][2] = PVar4.super_Tuple3<pbrt::Point3,_float>.z;
    auVar2._0_8_ = PVar4.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar2._8_56_ = auVar3;
    local_468.m.m[0]._0_8_ = vmovlps_avx(auVar2._0_16_);
    Translate((Vector3f *)&local_468);
  }
  else {
    if (iVar1 != 0) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
               ,0x30,"Unhandled rendering coordinate space");
    }
    AnimatedTransform::Interpolate
              (&local_2e8.startTransform,worldFromCamera,
               (worldFromCamera->startTime + worldFromCamera->endTime) * 0.5);
  }
  *(undefined8 *)(this->worldFromRender).mInv.m[0] = local_2e8.startTransform.mInv.m[0]._0_8_;
  *(undefined8 *)((this->worldFromRender).mInv.m[0] + 2) = local_2e8.startTransform.mInv.m[0]._8_8_;
  *(undefined8 *)(this->worldFromRender).mInv.m[1] = local_2e8.startTransform.mInv.m[1]._0_8_;
  *(undefined8 *)((this->worldFromRender).mInv.m[1] + 2) = local_2e8.startTransform.mInv.m[1]._8_8_;
  *(undefined8 *)(this->worldFromRender).mInv.m[2] = local_2e8.startTransform.mInv.m[2]._0_8_;
  *(undefined8 *)((this->worldFromRender).mInv.m[2] + 2) = local_2e8.startTransform.mInv.m[2]._8_8_;
  *(undefined8 *)(this->worldFromRender).mInv.m[3] = local_2e8.startTransform.mInv.m[3]._0_8_;
  *(undefined8 *)((this->worldFromRender).mInv.m[3] + 2) = local_2e8.startTransform.mInv.m[3]._8_8_;
  *(undefined8 *)(this_00->m).m[0] = local_2e8.startTransform.m.m[0]._0_8_;
  *(undefined8 *)((this->worldFromRender).m.m[0] + 2) = local_2e8.startTransform.m.m[0]._8_8_;
  *(undefined8 *)(this->worldFromRender).m.m[1] = local_2e8.startTransform.m.m[1]._0_8_;
  *(undefined8 *)((this->worldFromRender).m.m[1] + 2) = local_2e8.startTransform.m.m[1]._8_8_;
  *(undefined8 *)(this->worldFromRender).m.m[2] = local_2e8.startTransform.m.m[2]._0_8_;
  *(undefined8 *)((this->worldFromRender).m.m[2] + 2) = local_2e8.startTransform.m.m[2]._8_8_;
  *(undefined8 *)(this->worldFromRender).m.m[3] = local_2e8.startTransform.m.m[3]._0_8_;
  *(undefined8 *)((this->worldFromRender).m.m[3] + 2) = local_2e8.startTransform.m.m[3]._8_8_;
  local_368.m.m[0]._0_8_ = *(undefined8 *)(this->worldFromRender).mInv.m[0];
  local_368.m.m[0]._8_8_ = *(undefined8 *)((this->worldFromRender).mInv.m[0] + 2);
  local_368.m.m[1]._0_8_ = *(undefined8 *)(this->worldFromRender).mInv.m[1];
  local_368.m.m[1]._8_8_ = *(undefined8 *)((this->worldFromRender).mInv.m[1] + 2);
  local_368.m.m[2]._0_8_ = *(undefined8 *)(this->worldFromRender).mInv.m[2];
  local_368.m.m[2]._8_8_ = *(undefined8 *)((this->worldFromRender).mInv.m[2] + 2);
  local_368.m.m[3]._0_8_ = *(undefined8 *)(this->worldFromRender).mInv.m[3];
  local_368.m.m[3]._8_8_ = *(undefined8 *)((this->worldFromRender).mInv.m[3] + 2);
  local_368.mInv.m[0]._0_8_ = *(undefined8 *)(this_00->m).m[0];
  local_368.mInv.m[0]._8_8_ = *(undefined8 *)((this->worldFromRender).m.m[0] + 2);
  local_368.mInv.m[1]._0_8_ = *(undefined8 *)(this->worldFromRender).m.m[1];
  local_368.mInv.m[1]._8_8_ = *(undefined8 *)((this->worldFromRender).m.m[1] + 2);
  local_368.mInv.m[2]._0_8_ = *(undefined8 *)(this->worldFromRender).m.m[2];
  local_368.mInv.m[2]._8_8_ = *(undefined8 *)((this->worldFromRender).m.m[2] + 2);
  local_368.mInv.m[3]._0_8_ = *(undefined8 *)(this->worldFromRender).m.m[3];
  local_368.mInv.m[3]._8_8_ = *(undefined8 *)((this->worldFromRender).m.m[3] + 2);
  Transform::operator*(&local_468,&local_368,&worldFromCamera->startTransform);
  Transform::operator*(&local_3e8,&local_368,&worldFromCamera->endTransform);
  AnimatedTransform::AnimatedTransform
            (&local_2e8,&local_468,worldFromCamera->startTime,&local_3e8,worldFromCamera->endTime);
  memcpy(this,&local_2e8,0x2b8);
  return;
}

Assistant:

CameraTransform::CameraTransform(const AnimatedTransform &worldFromCamera) {
    switch (Options->renderingSpace) {
    case RenderingCoordinateSystem::Camera: {
        // Compute _worldFromRender_ for camera-space rendering
        Float tMid = (worldFromCamera.startTime + worldFromCamera.endTime) / 2;
        worldFromRender = worldFromCamera.Interpolate(tMid);
        break;
    }
    case RenderingCoordinateSystem::CameraWorld: {
        // Compute _worldFromRender_ for camera-world space rendering
        Float tMid = (worldFromCamera.startTime + worldFromCamera.endTime) / 2;
        Point3f pCamera = worldFromCamera(Point3f(0, 0, 0), tMid);
        worldFromRender = Translate(Vector3f(pCamera));
        break;
    }
    case RenderingCoordinateSystem::World: {
        // Compute _worldFromRender_ for world-space rendering
        worldFromRender = Transform();
        break;
    }
    default:
        LOG_FATAL("Unhandled rendering coordinate space");
    }
    // Compute _renderFromCamera_ transformation
    Transform renderFromWorld = Inverse(worldFromRender);
    Transform rfc[2] = {renderFromWorld * worldFromCamera.startTransform,
                        renderFromWorld * worldFromCamera.endTransform};
    renderFromCamera = AnimatedTransform(rfc[0], worldFromCamera.startTime, rfc[1],
                                         worldFromCamera.endTime);
}